

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void http_parse_query(http_s *h)

{
  ulong uVar1;
  size_t sVar2;
  char cVar3;
  FIOBJ FVar4;
  fiobj_object_vtable_s *pfVar5;
  char *pcVar6;
  void *pvVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  fio_str_info_s q;
  fio_str_info_s local_38;
  
  if (h->query == 0) {
    return;
  }
  if (h->params == 0) {
    FVar4 = fiobj_hash_new();
    h->params = FVar4;
  }
  uVar1 = h->query;
  if (uVar1 == 0) {
LAB_0014a678:
    local_38.data = anon_var_dwarf_20f;
    local_38.capa = 0;
    local_38.len = 4;
    goto LAB_0014a730;
  }
  if ((uVar1 & 1) != 0) {
    fio_ltocstr(&local_38,(long)uVar1 >> 1);
    goto LAB_0014a730;
  }
  uVar8 = (uint)uVar1 & 6;
  cVar3 = '(';
  switch(uVar8) {
  case 0:
switchD_0014a644_caseD_0:
    cVar3 = *(char *)(uVar1 & 0xfffffffffffffff8);
    break;
  case 4:
switchD_0014a644_caseD_4:
    cVar3 = '*';
    break;
  case 6:
    if ((char)uVar1 == '&') {
      local_38.data = anon_var_dwarf_21a;
      local_38.capa = 0;
      local_38.len = 5;
      goto LAB_0014a730;
    }
    uVar9 = (uint)uVar1 & 0xff;
    if (uVar9 == 0x16) {
      local_38.data = anon_var_dwarf_225;
      local_38.capa = 0;
      local_38.len = 4;
      goto LAB_0014a730;
    }
    if (uVar9 == 6) goto LAB_0014a678;
    switch(uVar8) {
    case 0:
      goto switchD_0014a644_caseD_0;
    case 4:
      goto switchD_0014a644_caseD_4;
    case 6:
      cVar3 = (char)uVar1;
    }
  }
  switch(cVar3) {
  case '\'':
    pfVar5 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case '(':
    pfVar5 = &FIOBJECT_VTABLE_STRING;
    break;
  case ')':
    pfVar5 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case '*':
    pfVar5 = &FIOBJECT_VTABLE_HASH;
    break;
  case '+':
    pfVar5 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    pfVar5 = &FIOBJECT_VTABLE_NUMBER;
  }
  (*pfVar5->to_str)(&local_38,uVar1);
LAB_0014a730:
  do {
    pcVar11 = local_38.data;
    sVar2 = local_38.len;
    pcVar6 = (char *)memchr(local_38.data,0x26,local_38.len);
    pcVar10 = pcVar11 + sVar2;
    if (pcVar6 != (char *)0x0) {
      pcVar10 = pcVar6;
    }
    pvVar7 = memchr(pcVar11,0x3d,(long)pcVar10 - (long)pcVar11);
    if (pvVar7 != (void *)0x0) {
      http_add2hash(h->params,pcVar11,(long)pvVar7 - (long)pcVar11,(char *)((long)pvVar7 + 1),
                    (long)pcVar10 - ((long)pvVar7 + 1),'\x01');
    }
    pcVar11 = pcVar10;
    if ((((*pcVar10 == '&') && (pcVar11 = pcVar10 + 1, pcVar10[1] == 'a')) && (pcVar10[2] == 'm'))
       && ((pcVar10[3] == 'p' && (pcVar10[4] == ';')))) {
      pcVar11 = pcVar10 + 5;
    }
    local_38.len = (size_t)(local_38.data + (local_38.len - (long)pcVar11));
    local_38.data = pcVar11;
  } while ((char *)local_38.len != (char *)0x0);
  return;
}

Assistant:

void http_parse_query(http_s *h) {
  if (!h->query)
    return;
  if (!h->params)
    h->params = fiobj_hash_new();
  fio_str_info_s q = fiobj_obj2cstr(h->query);
  do {
    char *cut = memchr(q.data, '&', q.len);
    if (!cut)
      cut = q.data + q.len;
    char *cut2 = memchr(q.data, '=', (cut - q.data));
    if (cut2) {
      /* we only add named elements... */
      http_add2hash(h->params, q.data, (size_t)(cut2 - q.data), (cut2 + 1),
                    (size_t)(cut - (cut2 + 1)), 1);
    }
    if (cut[0] == '&') {
      /* protecting against some ...less informed... clients */
      if (cut[1] == 'a' && cut[2] == 'm' && cut[3] == 'p' && cut[4] == ';')
        cut += 5;
      else
        cut += 1;
    }
    q.len -= (uintptr_t)(cut - q.data);
    q.data = cut;
  } while (q.len);
}